

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O3

void gen_WARD_anisotropic_phong_shade
               (float *cl,float *cp,float *l,float *e,float *n,float pu,float pv,float y,
               float *clambert)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3 v;
  vec3 kspec;
  vec3 h;
  vec3 y_v;
  float local_74 [6];
  float afStack_5c [3];
  undefined8 local_50;
  float local_48;
  float local_40;
  float local_3c [3];
  
  lVar1 = 0;
  do {
    local_74[lVar1 + 6] = e[lVar1] + l[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_74[lVar1 + 6] * local_74[lVar1 + 6];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    local_40 = y;
    fVar2 = sqrtf(fVar2);
    y = local_40;
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    local_74[lVar1 + 6] = local_74[lVar1 + 6] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  local_3c[0] = 0.0;
  local_3c[1] = y;
  local_3c[2] = 0.0;
  fVar2 = 0.0;
  do {
    fVar2 = fVar2 + local_3c[lVar1] * n[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    local_74[lVar1] = n[lVar1] * fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    local_74[lVar1] = local_3c[lVar1] - local_74[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_74[lVar1] * local_74[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    local_74[lVar1] = local_74[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = (float)*(undefined8 *)(n + 1);
  fVar3 = (float)((ulong)*(undefined8 *)(n + 1) >> 0x20);
  local_50 = CONCAT44(*n * SUB84(local_74._4_8_,4) - local_74[0] * fVar3,
                      fVar3 * (float)local_74._4_8_ - SUB84(local_74._4_8_,4) * fVar2);
  local_48 = local_74[0] * fVar2 - *n * (float)local_74._4_8_;
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = *(float *)((long)&local_50 + lVar1 * 4);
    fVar2 = fVar2 + fVar3 * fVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    *(float *)((long)&local_50 + lVar1 * 4) =
         *(float *)((long)&local_50 + lVar1 * 4) * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + l[lVar1] * n[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + l[lVar1] * n[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = fVar4 + e[lVar1] * n[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar4 = (fVar2 / fVar3) * fVar4;
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  lVar1 = 0;
  do {
    local_74[lVar1 + 3] = cp[lVar1] * SQRT(fVar4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    local_74[lVar1 + 3] = local_74[lVar1 + 3] * (1.0 / (pu * 12.566371 * pv));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + *(float *)((long)&local_50 + lVar1 * 4) * local_74[lVar1 + 6];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = sqr(fVar2 / pu);
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + local_74[lVar1] * local_74[lVar1 + 6];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar3 = sqr(fVar3 / pv);
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = fVar4 + n[lVar1] * local_74[lVar1 + 6];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = expf(((fVar2 + fVar3) * -2.0) / (fVar4 + 1.0));
  lVar1 = 0;
  do {
    local_74[lVar1 + 3] = local_74[lVar1 + 3] * fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  vec3_fraction(local_74 + 3,local_74 + 3,cl);
  lVar1 = 0;
  do {
    clambert[lVar1] = clambert[lVar1] + local_74[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_WARD_anisotropic_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const float pu, const float pv, const float y, vec3 clambert){
    //calculate h
    vec3 h;
    vec3_add(h, e, l);
    vec3_norm(h,h);

    //calculate u and v unit vector
    vec3 v;
    vec3 y_v = {0.0f, y, 0.0f};
    vec3_scale(v, n, vec3_mul_inner(n,y_v));
    vec3_sub(v, y_v, v);
    vec3_norm(v,v);
    vec3 u;
    vec3_mul_cross(u, v, n);
    vec3_norm(u,u);
    
    //calculate kspecular
    vec3 kspec;
    vec3_scale(kspec, cp, sqrt( std::max(0.0f, vec3_mul_inner(n,l) / vec3_mul_inner(n,l)*vec3_mul_inner(n,e)) )); //first term of the multiplication
    vec3_scale(kspec, kspec, 1.0f / (4.0f*PI*pu*pv) ); //second term
    vec3_scale(kspec, kspec, exp( -2.0f * (sqr(vec3_mul_inner(h,u)/pu) + sqr(vec3_mul_inner(h,v)/pv)) / (1.0f+vec3_mul_inner(h,n)) ) ); //thrid term
    vec3_fraction(kspec, kspec, cl); //control one more time by light color

    //add specular to lambertian shade
    vec3_add(clambert, clambert, kspec);
    vec3_cull(clambert);
}